

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O2

int __thiscall OPLio::OPLinit(OPLio *this,uint numchips,bool stereo,bool initopl3)

{
  uint uVar1;
  OPLEmul *pOVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  
  if (7 < numchips - 1) {
    __assert_fail("numchips >= 1 && numchips <= countof(chips)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/oplsynth/mlopl_io.cpp"
                  ,0x146,"virtual int OPLio::OPLinit(uint, bool, bool)");
  }
  bVar5 = current_opl_core - 1U < 3;
  this->IsOPL3 = (bool)bVar5;
  this->chips[0] = (OPLEmul *)0x0;
  this->chips[1] = (OPLEmul *)0x0;
  this->chips[2] = (OPLEmul *)0x0;
  this->chips[3] = (OPLEmul *)0x0;
  this->chips[4] = (OPLEmul *)0x0;
  this->chips[5] = (OPLEmul *)0x0;
  this->chips[6] = (OPLEmul *)0x0;
  this->chips[7] = (OPLEmul *)0x0;
  uVar1 = numchips + 1 >> 1;
  if (!(bool)bVar5) {
    uVar1 = numchips;
  }
  uVar4 = 0;
  do {
    if (uVar1 == uVar4) {
      uVar4 = (ulong)uVar1;
LAB_0033dac8:
      uVar3 = (uint)uVar4;
      this->NumChips = uVar3;
      this->OPLchannels = ((bVar5 & 1) * 9 + 9) * uVar3;
      OPLwriteInitState(this,initopl3);
      return uVar3;
    }
    if ((bVar5 & 1) == 0) {
      pOVar2 = YM3812Create(stereo);
    }
    else if (current_opl_core == 2) {
      pOVar2 = JavaOPLCreate(stereo);
    }
    else if (current_opl_core == 1) {
      pOVar2 = DBOPLCreate(stereo);
    }
    else {
      pOVar2 = NukedOPL3Create(stereo);
    }
    if (pOVar2 == (OPLEmul *)0x0) {
      bVar5 = this->IsOPL3;
      goto LAB_0033dac8;
    }
    this->chips[uVar4] = pOVar2;
    uVar4 = uVar4 + 1;
    bVar5 = this->IsOPL3;
  } while( true );
}

Assistant:

int OPLio::OPLinit(uint numchips, bool stereo, bool initopl3)
{
	assert(numchips >= 1 && numchips <= countof(chips));
	uint i;
	IsOPL3 = (current_opl_core == 1 || current_opl_core == 2 || current_opl_core == 3);

	memset(chips, 0, sizeof(chips));
	if (IsOPL3)
	{
		numchips = (numchips + 1) >> 1;
	}
	for (i = 0; i < numchips; ++i)
	{
		OPLEmul *chip = IsOPL3 ? (current_opl_core == 1 ? DBOPLCreate(stereo) : (current_opl_core == 2 ? JavaOPLCreate(stereo) : NukedOPL3Create(stereo))) : YM3812Create(stereo);
		if (chip == NULL)
		{
			break;
		}
		chips[i] = chip;
	}
	NumChips = i;
	OPLchannels = i * (IsOPL3 ? OPL3CHANNELS : OPL2CHANNELS);
	OPLwriteInitState(initopl3);
	return i;
}